

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O0

void amrex::parser_ast_setconst(parser_node *node,char *name,double c)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  parser_node *in_RSI;
  int *in_RDI;
  char *in_XMM0_Qa;
  string *msg;
  char *in_stack_ffffffffffffff98;
  string local_58;
  string local_38 [20];
  int in_stack_ffffffffffffffdc;
  double in_stack_ffffffffffffffe0;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(*in_RDI - 1);
  switch(__rhs) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    iVar1 = strcmp((char *)in_RSI,*(char **)(in_RDI + 2));
    if (iVar1 == 0) {
      *in_RDI = 1;
      *(char **)(in_RDI + 2) = in_XMM0_Qa;
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13:
    parser_ast_setconst(in_RSI,in_XMM0_Qa,in_stack_ffffffffffffffe0);
    parser_ast_setconst(in_RSI,in_XMM0_Qa,in_stack_ffffffffffffffe0);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14:
    parser_ast_setconst(in_RSI,in_XMM0_Qa,in_stack_ffffffffffffffe0);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7:
    parser_ast_setconst(in_RSI,in_XMM0_Qa,in_stack_ffffffffffffffe0);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8:
    parser_ast_setconst(in_RSI,in_XMM0_Qa,in_stack_ffffffffffffffe0);
    parser_ast_setconst(in_RSI,in_XMM0_Qa,in_stack_ffffffffffffffe0);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9:
    parser_ast_setconst(in_RSI,in_XMM0_Qa,in_stack_ffffffffffffffe0);
    parser_ast_setconst(in_RSI,in_XMM0_Qa,in_stack_ffffffffffffffe0);
    parser_ast_setconst(in_RSI,in_XMM0_Qa,in_stack_ffffffffffffffe0);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa:
    parser_ast_setconst(in_RSI,in_XMM0_Qa,in_stack_ffffffffffffffe0);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12:
    parser_ast_setconst(in_RSI,in_XMM0_Qa,in_stack_ffffffffffffffe0);
    break;
  default:
    msg = &local_58;
    std::__cxx11::to_string(in_stack_ffffffffffffffdc);
    std::operator+(in_stack_ffffffffffffff98,__rhs);
    Abort(msg);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void parser_ast_setconst (struct parser_node* node, char const* name, double c)
{
    switch (node->type)
    {
    case PARSER_NUMBER:
        break;
    case PARSER_SYMBOL:
        if (std::strcmp(name, ((struct parser_symbol*)node)->name) == 0) {
            ((struct parser_number*)node)->type = PARSER_NUMBER;
            ((struct parser_number*)node)->value = c;
        }
        break;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
    case PARSER_LIST:
        parser_ast_setconst(node->l, name, c);
        parser_ast_setconst(node->r, name, c);
        break;
    case PARSER_NEG:
    case PARSER_NEG_P:
        parser_ast_setconst(node->l, name, c);
        break;
    case PARSER_F1:
        parser_ast_setconst(((struct parser_f1*)node)->l, name, c);
        break;
    case PARSER_F2:
        parser_ast_setconst(((struct parser_f2*)node)->l, name, c);
        parser_ast_setconst(((struct parser_f2*)node)->r, name, c);
        break;
    case PARSER_F3:
        parser_ast_setconst(((struct parser_f3*)node)->n1, name, c);
        parser_ast_setconst(((struct parser_f3*)node)->n2, name, c);
        parser_ast_setconst(((struct parser_f3*)node)->n3, name, c);
        break;
    case PARSER_ASSIGN:
        parser_ast_setconst(((struct parser_assign*)node)->v, name, c);
        break;
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
        parser_ast_setconst(node->r, name, c);
        break;
    default:
        amrex::Abort("parser_ast_setconst: unknown node type " + std::to_string(node->type));
    }
}